

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

GCtab * lj_lib_checktabornil(lua_State *L,int narg)

{
  TValue *pTVar1;
  TValue *o;
  int narg_local;
  lua_State *L_local;
  
  pTVar1 = L->base + (long)narg + -1;
  if (pTVar1 < L->top) {
    if ((int)(pTVar1->field_4).it >> 0xf == -0xc) {
      L_local = (lua_State *)(pTVar1->u64 & 0x7fffffffffff);
    }
    else {
      if (pTVar1->u64 != 0xffffffffffffffff) goto LAB_001a13e7;
      L_local = (lua_State *)0x0;
    }
    return (GCtab *)L_local;
  }
LAB_001a13e7:
  lj_err_arg(L,narg,LJ_ERR_NOTABN);
}

Assistant:

GCtab *lj_lib_checktabornil(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (tvistab(o))
      return tabV(o);
    else if (tvisnil(o))
      return NULL;
  }
  lj_err_arg(L, narg, LJ_ERR_NOTABN);
  return NULL;  /* unreachable */
}